

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

char * __thiscall DynamicHistogram<double>::index(DynamicHistogram<double> *this,char *__s,int __c)

{
  int iVar1;
  uint uVar2;
  runtime_error *this_00;
  undefined4 in_register_00000014;
  double in_XMM0_Qa;
  double dVar3;
  
  iVar1 = (*this->_vptr_DynamicHistogram[2])(this,__s,CONCAT44(in_register_00000014,__c));
  if ((char)iVar1 != '\0') {
    if ((this->_binMax != in_XMM0_Qa) || (NAN(this->_binMax) || NAN(in_XMM0_Qa))) {
      dVar3 = floor((in_XMM0_Qa - this->_binMin) / this->_binWidth);
      uVar2 = (uint)dVar3;
    }
    else {
      uVar2 = this->_binCount - 1;
    }
    return (char *)(ulong)uVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"DynamicHistogram::index - Histogram could not be initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int
    index(T const value)
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::index - Histogram could not be initialized.");
        return this->index_(value);
    }